

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHingeConstraint.cpp
# Opt level: O0

btScalar __thiscall
btHingeConstraint::getHingeAngle(btHingeConstraint *this,btTransform *transA,btTransform *transB)

{
  btMatrix3x3 *v;
  btTransform *in_RDX;
  btTransform *in_RSI;
  long in_RDI;
  btScalar bVar1;
  btScalar angle;
  btVector3 swingAxis;
  btVector3 refAxis1;
  btVector3 refAxis0;
  btVector3 *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 uVar2;
  btVector3 local_68;
  btScalar local_58 [4];
  btVector3 local_48;
  btScalar local_38 [4];
  btVector3 local_28;
  btTransform *local_18;
  btTransform *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  btTransform::getBasis(in_RSI);
  btTransform::getBasis((btTransform *)(in_RDI + 0x240));
  local_38 = (btScalar  [4])
             btMatrix3x3::getColumn
                       ((btMatrix3x3 *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                        ,(int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
  local_28 = ::operator*((btMatrix3x3 *)
                         CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         in_stack_ffffffffffffff58);
  v = btTransform::getBasis(local_10);
  btTransform::getBasis((btTransform *)(in_RDI + 0x240));
  uVar2 = 1;
  local_58 = (btScalar  [4])
             btMatrix3x3::getColumn
                       ((btMatrix3x3 *)CONCAT44(1,in_stack_ffffffffffffff60),(int)((ulong)v >> 0x20)
                       );
  local_48 = ::operator*((btMatrix3x3 *)CONCAT44(uVar2,in_stack_ffffffffffffff60),v->m_el);
  btTransform::getBasis(local_18);
  btTransform::getBasis((btTransform *)(in_RDI + 0x280));
  btMatrix3x3::getColumn
            ((btMatrix3x3 *)CONCAT44(uVar2,in_stack_ffffffffffffff60),(int)((ulong)v >> 0x20));
  local_68 = ::operator*((btMatrix3x3 *)CONCAT44(uVar2,in_stack_ffffffffffffff60),v->m_el);
  btVector3::dot(&local_68,&local_28);
  btVector3::dot(&local_68,&local_48);
  bVar1 = btAtan2(0.0,3.036761e-39);
  return *(float *)(in_RDI + 0x2f4) * bVar1;
}

Assistant:

btScalar btHingeConstraint::getHingeAngle(const btTransform& transA,const btTransform& transB)
{
	const btVector3 refAxis0  = transA.getBasis() * m_rbAFrame.getBasis().getColumn(0);
	const btVector3 refAxis1  = transA.getBasis() * m_rbAFrame.getBasis().getColumn(1);
	const btVector3 swingAxis = transB.getBasis() * m_rbBFrame.getBasis().getColumn(1);
//	btScalar angle = btAtan2Fast(swingAxis.dot(refAxis0), swingAxis.dot(refAxis1));
	btScalar angle = btAtan2(swingAxis.dot(refAxis0), swingAxis.dot(refAxis1));
	return m_referenceSign * angle;
}